

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-dump.c
# Opt level: O1

char * fy_token_list_dump_format(fy_token_list *fytl,fy_token *fyt_highlight,char *buf,size_t bufsz)

{
  fy_token *pfVar1;
  int iVar2;
  fy_token *pfVar3;
  size_t sVar4;
  char *pcVar5;
  fy_token *pfVar6;
  char *pcVar7;
  char *pcVar8;
  
  if (fytl == (fy_token_list *)0x0) {
    pfVar6 = (fy_token *)0x0;
  }
  else {
    pfVar3 = (fy_token *)(fytl->_lh).next;
    pfVar6 = (fy_token *)0x0;
    if (pfVar3 != (fy_token *)fytl) {
      pfVar6 = pfVar3;
    }
  }
  pcVar8 = buf;
  if (pfVar6 != (fy_token *)0x0) {
    do {
      if (fytl == (fy_token_list *)0x0) {
        pfVar3 = (fy_token *)0x0;
      }
      else {
        pfVar1 = (fy_token *)(fytl->_lh).next;
        pfVar3 = (fy_token *)0x0;
        if (pfVar1 != (fy_token *)fytl) {
          pfVar3 = pfVar1;
        }
      }
      pcVar5 = "";
      if (pfVar6 != pfVar3) {
        pcVar5 = ",";
      }
      pcVar7 = "*";
      if (pfVar6 != fyt_highlight) {
        pcVar7 = "";
      }
      iVar2 = snprintf(pcVar8,(size_t)(buf + ((bufsz - 1) - (long)pcVar8)),"%s%s",pcVar5,pcVar7);
      if ((ulong)pfVar6->type < 0x17) {
        pcVar5 = fy_token_type_txt[pfVar6->type];
      }
      else {
        pcVar5 = (char *)0x0;
      }
      pcVar7 = "<NULL>";
      if (pcVar5 != (char *)0x0) {
        pcVar7 = pcVar5;
      }
      pcVar8 = pcVar8 + iVar2;
      snprintf(pcVar8,(size_t)(buf + ((bufsz - 1) - (long)pcVar8)),"%s",pcVar7);
      sVar4 = strlen(pcVar8);
      if ((fytl == (fy_token_list *)0x0) ||
         (pfVar6 = (fy_token *)(pfVar6->node).next, pfVar6 == (fy_token *)fytl)) {
        pfVar6 = (fy_token *)0x0;
      }
      pcVar8 = pcVar8 + sVar4;
    } while (pfVar6 != (fy_token *)0x0);
  }
  *pcVar8 = '\0';
  return buf;
}

Assistant:

char *fy_token_list_dump_format(struct fy_token_list *fytl,
                                struct fy_token *fyt_highlight, char *buf, size_t bufsz) {
    char *s, *e;
    struct fy_token *fyt;

    s = buf;
    e = buf + bufsz - 1;
    for (fyt = fy_token_list_first(fytl); fyt; fyt = fy_token_next(fytl, fyt)) {

        s += snprintf(s, e - s, "%s%s",
                      fyt != fy_token_list_first(fytl) ? "," : "",
                      fyt_highlight == fyt ? "*" : "");

        fy_token_dump_format(fyt, s, e - s);

        s += strlen(s);
    }
    *s = '\0';

    return buf;
}